

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  _func_void_char_ptr_FILE_ptr *p_Var4;
  FILE *fp;
  char *filename_1;
  char *arg;
  _Bool done_something;
  char *filename;
  code *pcStack_20;
  _Bool doing_opts;
  _func_void_char_ptr_FILE_ptr *testfn;
  char **argv_local;
  int argc_local;
  
  pcStack_20 = (code *)0x0;
  bVar1 = true;
  bVar2 = false;
  ctx = bidi_new_context();
  testfn = (_func_void_char_ptr_FILE_ptr *)argv;
  argv_local._0_4_ = argc;
  while( true ) {
    while( true ) {
      argv_local._0_4_ = (int)argv_local + -1;
      if ((int)argv_local < 1) {
        if (bVar2) {
          printf("pass %d fail %d total %d\n",(ulong)(uint)pass,(ulong)(uint)fail,
                 (ulong)(uint)(pass + fail));
          bidi_free_context(ctx);
          argv_local._4_4_ = (uint)(fail != 0);
        }
        else {
          usage((FILE *)_stderr);
          argv_local._4_4_ = 1;
        }
        return argv_local._4_4_;
      }
      p_Var4 = testfn + 8;
      __s1 = *(char **)(testfn + 8);
      testfn = p_Var4;
      if (((!bVar1) || (*__s1 != '-')) || (__s1[1] == '\0')) break;
      iVar3 = strcmp(__s1,"--");
      if (iVar3 == 0) {
        bVar1 = false;
      }
      else {
        iVar3 = strcmp(__s1,"--class");
        if (iVar3 == 0) {
          pcStack_20 = class_test;
        }
        else {
          iVar3 = strcmp(__s1,"--char");
          if (iVar3 != 0) {
            iVar3 = strcmp(__s1,"--help");
            if (iVar3 == 0) {
              usage(_stdout);
              return 0;
            }
            fprintf(_stderr,"unrecognised option \'%s\'\n",__s1);
            return 1;
          }
          pcStack_20 = char_test;
        }
      }
    }
    if (pcStack_20 == (code *)0x0) break;
    iVar3 = strcmp(__s1,"-");
    if (iVar3 == 0) {
      (*pcStack_20)("<standard input>",_stdin);
    }
    else {
      __stream = fopen(__s1,"r");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"unable to open \'%s\'\n",__s1);
        return 1;
      }
      (*pcStack_20)(__s1,__stream);
      fclose(__stream);
    }
    bVar2 = true;
  }
  fprintf(_stderr,"no mode argument provided before filename \'%s\'\n",__s1);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    void (*testfn)(const char *, FILE *) = NULL;
    bool doing_opts = true;
    const char *filename = NULL;
    bool done_something = false;

    ctx = bidi_new_context();

    while (--argc > 0) {
        const char *arg = *++argv;
        if (doing_opts && arg[0] == '-' && arg[1]) {
            if (!strcmp(arg, "--")) {
                doing_opts = false;
            } else if (!strcmp(arg, "--class")) {
                testfn = class_test;
            } else if (!strcmp(arg, "--char")) {
                testfn = char_test;
            } else if (!strcmp(arg, "--help")) {
                usage(stdout);
                return 0;
            } else {
                fprintf(stderr, "unrecognised option '%s'\n", arg);
                return 1;
            }
        } else {
            const char *filename = arg;

            if (!testfn) {
                fprintf(stderr, "no mode argument provided before filename "
                        "'%s'\n", filename);
                return 1;
            }

            if (!strcmp(filename, "-")) {
                testfn("<standard input>", stdin);
            } else {
                FILE *fp = fopen(filename, "r");
                if (!fp) {
                    fprintf(stderr, "unable to open '%s'\n", filename);
                    return 1;
                }
                testfn(filename, fp);
                fclose(fp);
            }
            done_something = true;
        }
    }

    if (!done_something) {
        usage(stderr);
        return 1;
    }

    if (!filename)
        filename = "-";

    printf("pass %d fail %d total %d\n", pass, fail, pass + fail);

    bidi_free_context(ctx);
    return fail != 0;
}